

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int process_symbol(byte_t symbol,byte_t *output_buffer,FILE *output_file_ptr)

{
  adh_node_t *node_00;
  adh_node_t *node;
  int rc;
  FILE *output_file_ptr_local;
  byte_t *output_buffer_local;
  byte_t symbol_local;
  
  node_00 = adh_search_symbol_in_tree((ushort)symbol);
  if (node_00 == (adh_node_t *)0x0) {
    node._4_4_ = output_nyt(output_buffer,output_file_ptr);
    if (node._4_4_ == 0) {
      node._4_4_ = output_new_symbol(symbol,output_buffer,output_file_ptr);
    }
  }
  else {
    node._4_4_ = output_existing_symbol(symbol,node_00,output_buffer,output_file_ptr);
  }
  return node._4_4_;
}

Assistant:

int process_symbol(byte_t symbol, byte_t *output_buffer, FILE* output_file_ptr) {
#ifdef _DEBUG
    log_debug(" process_symbol", "%s out_bit_idx=%-8d\n",
            fmt_symbol(symbol),
            out_bit_idx);
#endif
    int rc;
    adh_node_t* node = adh_search_symbol_in_tree(symbol);
    if(node == NULL) {
        // symbol not present in tree
        rc = output_nyt(output_buffer, output_file_ptr);
        if(rc == RC_OK) {
            rc = output_new_symbol(symbol, output_buffer, output_file_ptr);
        }
    } else {
        // symbol already present in tree
        rc = output_existing_symbol(symbol, node, output_buffer, output_file_ptr);
    }
    return rc;
}